

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::transformed_draw_extra
          (Fl_PostScript_Graphics_Driver *this,char *str,int n,double x,double y,int w,bool rtl)

{
  uint uVar1;
  Fl_Graphics_Driver *pFVar2;
  char *pcVar3;
  int iVar4;
  Fl_Color FVar5;
  Fl_Display_Device *pFVar6;
  uchar *puVar7;
  void *data;
  uint uVar8;
  uchar *puVar9;
  byte *pbVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  undefined7 in_register_00000081;
  uint uVar14;
  uchar *puVar15;
  uint w_00;
  long lVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  float fVar20;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  uchar local_b3;
  uchar green;
  uchar red;
  ulong local_b0;
  byte *local_a8;
  uint local_9c;
  Fl_Color local_98;
  uint local_94;
  int local_90;
  int local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  char *local_78;
  Fl_Surface_Device *local_70;
  Window local_68;
  Window local_60;
  double local_58;
  double local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  local_90 = (int)CONCAT71(in_register_00000081,rtl);
  local_b0 = CONCAT44(local_b0._4_4_,(this->super_Fl_Graphics_Driver).size_);
  local_a8 = (byte *)CONCAT44(local_a8._4_4_,(this->super_Fl_Graphics_Driver).font_);
  local_94 = n;
  local_8c = w;
  local_78 = str;
  local_58 = x;
  local_50 = y;
  iVar4 = (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x3a])();
  local_88 = (float)iVar4;
  local_9c = (uint)local_88;
  uVar1 = (this->super_Fl_Graphics_Driver).color_;
  fStack_84 = extraout_XMM0_Db;
  fStack_80 = extraout_XMM0_Dc;
  fStack_7c = extraout_XMM0_Dd;
  FVar5 = fl_contrast(0xff,uVar1);
  local_48 = (int)local_88;
  iStack_44 = (int)fStack_84;
  iStack_40 = (int)fStack_80;
  iStack_3c = (int)fStack_7c;
  local_88 = (float)local_48;
  fStack_84 = (float)iStack_44;
  fStack_80 = (float)iStack_40;
  fStack_7c = (float)iStack_3c;
  fVar20 = local_88 + 3.0;
  local_98 = FVar5;
  local_60 = XCreatePixmap(fl_display,
                           *(undefined8 *)
                            (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                           (int)((double)w * 1.5),(int)fVar20,fl_visual->depth);
  local_68 = fl_window;
  fl_window = local_60;
  local_70 = Fl_Surface_Device::surface();
  pFVar6 = Fl_Display_Device::display_device();
  (*(pFVar6->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar6);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,0,0,(ulong)(uint)(int)((double)w * 1.5),(ulong)(uint)(int)fVar20);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)uVar1);
  pbVar10 = local_a8;
  pFVar2 = fl_graphics_driver;
  fl_graphics_driver->font_descriptor_ = (Fl_Font_Descriptor *)0x0;
  (*(pFVar2->super_Fl_Device)._vptr_Fl_Device[0x36])(pFVar2,(ulong)local_a8 & 0xffffffff,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)pbVar10 & 0xffffffff,(ulong)(uint)(int)(float)(int)local_b0);
  pcVar3 = local_78;
  uVar1 = local_94;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
            (fl_graphics_driver,local_78,(ulong)local_94);
  w_00 = (uint)(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da);
  uVar8 = 1;
  if (local_90 != 0) {
    uVar8 = w_00;
  }
  (**(code **)((ulong)(uint)(local_90 << 4) + 0x70 +
              (long)(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device))
            (fl_graphics_driver,pcVar3,uVar1,uVar8,(int)((double)local_48 * 0.8));
  uVar8 = local_9c;
  puVar7 = fl_read_image((uchar *)0x0,1,1,w_00,local_9c,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = local_68;
  (*(local_70->super_Fl_Device)._vptr_Fl_Device[3])();
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
            (this,(ulong)local_a8 & 0xffffffff,local_b0 & 0xffffffff);
  XFreePixmap(fl_display,local_60);
  Fl::get_color(local_98,&red,&green,&local_b3);
  iVar4 = (int)(w_00 + 7) / 8;
  local_a8 = (byte *)operator_new__((long)(int)(iVar4 * uVar8));
  uVar1 = 0;
  if (0 < (int)w_00) {
    uVar1 = w_00;
  }
  puVar9 = puVar7 + 2;
  pbVar10 = local_a8;
  uVar17 = uVar8;
  while (0 < (int)uVar17) {
    uVar17 = uVar17 - 1;
    bVar13 = 0x80;
    bVar12 = 0;
    puVar15 = puVar9;
    uVar14 = uVar1;
    while (bVar19 = uVar14 != 0, uVar14 = uVar14 - 1, bVar19) {
      if (((puVar15[-2] != red) || (puVar15[-1] != green)) || (*puVar15 != local_b3)) {
        bVar12 = bVar12 | bVar13;
      }
      if (bVar13 < 2) {
        *pbVar10 = bVar12;
        pbVar10 = pbVar10 + 1;
        bVar13 = 0x80;
        bVar12 = 0;
      }
      else {
        bVar13 = bVar13 >> 1;
      }
      puVar15 = puVar15 + 3;
    }
    *pbVar10 = bVar12;
    pbVar10 = pbVar10 + 1;
    puVar9 = puVar9 + (ulong)uVar1 * 3;
  }
  local_b0 = (ulong)w_00;
  if (puVar7 != (uchar *)0x0) {
    operator_delete__(puVar7);
  }
  fVar20 = (float)(int)local_b0 / (float)local_8c;
  clocale_printf(this,"%g %g %g %g %d %d MI\n",SUB84(local_58,0),
                 local_50 + ((double)(int)uVar8 * -0.77) / (double)fVar20,
                 (double)((float)(int)local_b0 / fVar20),(double)(local_88 / fVar20),local_b0,
                 (ulong)uVar8);
  data = prepare_rle85(this);
  iVar18 = 0;
  if (0 < iVar4) {
    iVar18 = iVar4;
  }
  lVar11 = (long)(int)uVar8;
  pbVar10 = local_a8 + (lVar11 + -1) * (long)iVar4;
  local_b0 = -(long)iVar4;
  while (0 < lVar11) {
    lVar11 = lVar11 + -1;
    for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
      write_rle85(this,pbVar10[lVar16],data);
    }
    pbVar10 = pbVar10 + local_b0;
  }
  close_rle85(this,data);
  fputc(10,(FILE *)this->output);
  operator_delete__(local_a8);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::transformed_draw_extra(const char* str, int n, double x, double y, int w, bool rtl)
{
  // scale for bitmask computation
#if defined(USE_X11) && !USE_XFT
  float scale = 1; // don't scale because we can't expect to have scalable fonts
#else
  float scale = 2;
#endif
  Fl_Fontsize old_size = size();
  Fl_Font fontnum = Fl_Graphics_Driver::font();
  int w_scaled =  (int)(w * (scale + 0.5));
  int h = (int)(height() * scale);
  // create an offscreen image of the string
  Fl_Color text_color = Fl_Graphics_Driver::color();
  Fl_Color bg_color = fl_contrast(FL_WHITE, text_color);
  Fl_Offscreen off = fl_create_offscreen(w_scaled, (int)(h+3*scale) );
  fl_begin_offscreen(off);
  fl_color(bg_color);
  // color offscreen background with a shade contrasting with the text color
  fl_rectf(0, 0, w_scaled, (int)(h+3*scale) );
  fl_color(text_color);
#if defined(USE_X11) && !USE_XFT
  // force seeing this font as new so it's applied to the offscreen graphics context
  fl_graphics_driver->font_descriptor(NULL);
  fl_font(fontnum, 0);
#endif
  fl_font(fontnum, (Fl_Fontsize)(scale * old_size) );
  int w2 = (int)fl_width(str, n);
  // draw string in offscreen
  if (rtl) fl_rtl_draw(str, n, w2, (int)(h * 0.8) );
  else fl_draw(str, n, 1, (int)(h * 0.8) );
  // read (most of) the offscreen image
  uchar *img = fl_read_image(NULL, 1, 1, w2, h, 0);
  fl_end_offscreen();
  font(fontnum, old_size);
  fl_delete_offscreen(off);
  // compute the mask of what is not the background
  uchar *mask = calc_mask(img, w2, h, bg_color);
  delete[] img;
  // write the string image to PostScript as a scaled bitmask
  scale = w2 / float(w);
  clocale_printf("%g %g %g %g %d %d MI\n", x, y - h*0.77/scale, w2/scale, h/scale, w2, h);
  uchar *di;
  int wmask = (w2+7)/8;
  void *rle85 = prepare_rle85();
  for (int j = h - 1; j >= 0; j--){
    di = mask + j * wmask;
    for (int i = 0; i < wmask; i++){
      write_rle85(*di, rle85);
      di++;
    }
  }
  close_rle85(rle85); fputc('\n', output);
  delete[] mask;
}